

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O2

void test_fuzz(files *filesets)

{
  size_t sVar1;
  void *pvVar2;
  FILE *pFVar3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  char *pcVar7;
  archive_conflict *a;
  void *pvVar8;
  void *pvVar9;
  time_t tVar10;
  FILE *__s;
  size_t v2;
  archive *paVar11;
  long lVar12;
  files *pfVar13;
  ulong uVar14;
  size_t size;
  void *local_88;
  char *local_80;
  files *local_78;
  archive_entry *ae;
  files *local_68;
  long local_60;
  long local_58;
  FILE *local_50;
  int64_t blk_offset;
  size_t blk_size;
  void *blk;
  
  pcVar7 = getenv("SKIP_TEST_FUZZ");
  if (pcVar7 != (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                   ,L'@');
    test_skipping("Skipping fuzz tests due to SKIP_TEST_FUZZ environment variable");
    return;
  }
  local_60 = 0;
  local_68 = filesets;
  do {
    if (local_68[local_60].names == (char **)0x0) {
      return;
    }
    pfVar13 = local_68 + local_60;
    size = 0;
    extract_reference_files(local_68[local_60].names);
    local_78 = pfVar13;
    if (pfVar13->uncompress == 0) {
      local_88 = (void *)0x0;
      lVar12 = 0;
      pvVar9 = (void *)0x0;
      while (*(long *)((long)local_78->names + lVar12) != 0) {
        local_58 = lVar12;
        local_80 = slurpfile(&size,"%s");
        pvVar2 = local_88;
        pvVar8 = realloc(pvVar9,size + (long)local_88);
        wVar5 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                 ,L'|',(uint)(pvVar8 != (void *)0x0),"newraw != NULL",(void *)0x0);
        sVar1 = size;
        if (wVar5 == L'\0') {
          free(local_80);
          size = 0;
          goto LAB_00143b1a;
        }
        memcpy((void *)((long)pvVar8 + (long)pvVar2),local_80,size);
        size = (long)pvVar2 + sVar1;
        local_88 = (void *)size;
        free(local_80);
        pvVar9 = pvVar8;
        lVar12 = local_58 + 8;
      }
LAB_001437ca:
      if (size != 0) {
        local_88 = pvVar9;
        pvVar9 = malloc(size);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'\x8f',(uint)(pvVar9 != (void *)0x0),"image != NULL",(void *)0x0);
        if (pvVar9 == (void *)0x0) {
          free(local_88);
          return;
        }
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'\x96',(uint)(local_88 != (void *)0x0),"rawimage != NULL",(void *)0x0);
        tVar10 = time((time_t *)0x0);
        srand((uint)tVar10);
        pcVar7 = (char *)0x0;
        while (sVar1 = size, (int)pcVar7 != 1000) {
          local_80 = pcVar7;
          memcpy(pvVar9,local_88,size);
          iVar4 = (int)((long)((ulong)(uint)((int)sVar1 >> 0x1f) << 0x20 | sVar1 & 0xffffffff) / 100
                       );
          if (iVar4 < 5) {
            iVar4 = 4;
          }
          iVar6 = rand();
          uVar14 = (long)iVar6 % (long)iVar4 & 0xffffffff;
          if ((int)((long)iVar6 % (long)iVar4) < 1) {
            uVar14 = 0;
          }
          while (iVar4 = (int)uVar14, uVar14 = (ulong)(iVar4 - 1), iVar4 != 0) {
            iVar4 = rand();
            iVar6 = rand();
            *(char *)((long)pvVar9 + (ulong)(long)iVar6 % size) = (char)iVar4;
          }
          iVar4 = 4;
          pFVar3 = local_50;
          do {
            __s = pFVar3;
            iVar4 = iVar4 + -1;
            if (iVar4 == 0) break;
            __s = fopen("after.test.failure.send.this.file.to.libarchive.maintainers.with.system.details"
                        ,"wb");
            pFVar3 = (FILE *)0x0;
          } while (__s == (FILE *)0x0);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'·',(uint)(__s != (FILE *)0x0),"f != NULL",(void *)0x0);
          sVar1 = size;
          v2 = fwrite(pvVar9,1,size,__s);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'¸',sVar1,"(size_t)size",v2,"fwrite(image, 1, (size_t)size, f)",
                              (void *)0x0);
          local_50 = __s;
          fclose(__s);
          paVar11 = archive_read_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'¼',(uint)(paVar11 != (archive *)0x0),
                           "(a = archive_read_new()) != NULL",(void *)0x0);
          iVar4 = archive_read_support_filter_all(paVar11);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'¾',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)"
                              ,paVar11);
          iVar4 = archive_read_support_format_all(paVar11);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'À',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_all(a)"
                              ,paVar11);
          iVar4 = archive_read_open_memory(paVar11,pvVar9,size);
          if (iVar4 == 0) {
            while (iVar4 = archive_read_next_header(paVar11,&ae), iVar4 == 0) {
              do {
                iVar4 = archive_read_data_block(paVar11,&blk,&blk_size,&blk_offset);
              } while (iVar4 == 0);
            }
            archive_read_close(paVar11);
          }
          archive_read_free(paVar11);
          paVar11 = archive_read_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'Í',(uint)(paVar11 != (archive *)0x0),
                           "(a = archive_read_new()) != NULL",(void *)0x0);
          iVar4 = archive_read_support_filter_all(paVar11);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'Ï',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)"
                              ,paVar11);
          iVar4 = archive_read_support_format_all(paVar11);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'Ñ',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_all(a)"
                              ,paVar11);
          iVar4 = archive_read_open_memory(paVar11,pvVar9,size);
          if (iVar4 == 0) {
            do {
              iVar4 = archive_read_next_header(paVar11,&ae);
            } while (iVar4 == 0);
            archive_read_close(paVar11);
          }
          archive_read_free(paVar11);
          pcVar7 = (char *)(ulong)((int)local_80 + 1);
        }
        free(pvVar9);
        pvVar9 = local_88;
      }
LAB_00143b1a:
      free(pvVar9);
    }
    else {
      a = (archive_conflict *)archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                       ,L'Q',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                       ,(void *)0x0);
      iVar4 = archive_read_support_filter_all((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                          ,L'S',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)",a);
      iVar4 = archive_read_support_format_raw((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                          ,L'U',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_raw(a)",a);
      wVar5 = archive_read_open_filenames(a,pfVar13->names,0x4000);
      if (wVar5 == L'\0') {
        iVar4 = archive_read_next_header((archive *)a,&ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'a',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(a, &ae)",a);
        local_88 = malloc(30000000);
        size = archive_read_data((archive *)a,local_88,30000000);
        iVar4 = archive_read_next_header((archive *)a,&ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'e',1,"ARCHIVE_EOF",(long)iVar4,"archive_read_next_header(a, &ae)",a);
        iVar4 = archive_read_free((archive *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'g',0,"ARCHIVE_OK",(long)iVar4,"archive_read_free(a)",(void *)0x0);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'h',(uint)(size != 0),"size > 0",(void *)0x0);
        if ((*local_78->names == (char *)0x0) || (local_78->names[1] == (char *)0x0)) {
          failure("Internal buffer is not big enough for uncompressed test files");
        }
        else {
          failure("Internal buffer is not big enough for uncompressed test file: %s");
        }
        wVar5 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                 ,L'p',(uint)(size < buff3 + 0x552690),"size < buffsize",(void *)0x0
                                );
        pvVar9 = local_88;
        if (wVar5 != L'\0') goto LAB_001437ca;
        goto LAB_00143b1a;
      }
      archive_read_free((archive *)a);
      pfVar13 = local_78;
      if ((*local_78->names == (char *)0x0) || (local_78->names[1] == (char *)0x0)) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                       ,L'Z');
        test_skipping("Cannot uncompress fileset");
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                       ,L'\\');
        test_skipping("Cannot uncompress %s",*pfVar13->names);
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

static void
test_fuzz(const struct files *filesets)
{
	const void *blk;
	size_t blk_size;
	int64_t blk_offset;
	int n;
	const char *skip_fuzz_tests;

	skip_fuzz_tests = getenv("SKIP_TEST_FUZZ");
	if (skip_fuzz_tests != NULL) {
		skipping("Skipping fuzz tests due to SKIP_TEST_FUZZ "
		    "environment variable");
		return;
	}

	for (n = 0; filesets[n].names != NULL; ++n) {
		const size_t buffsize = 30000000;
		struct archive_entry *ae;
		struct archive *a;
		char *rawimage = NULL, *image = NULL, *tmp = NULL;
		size_t size = 0, oldsize = 0;
		int i, q;

		extract_reference_files(filesets[n].names);
		if (filesets[n].uncompress) {
			int r;
			/* Use format_raw to decompress the data. */
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_raw(a));
			r = archive_read_open_filenames(a, filesets[n].names, 16384);
			if (r != ARCHIVE_OK) {
				archive_read_free(a);
				if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
					skipping("Cannot uncompress fileset");
				} else {
					skipping("Cannot uncompress %s", filesets[n].names[0]);
				}
				continue;
			}
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			rawimage = malloc(buffsize);
			size = archive_read_data(a, rawimage, buffsize);
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
			assertEqualInt(ARCHIVE_OK,
			    archive_read_free(a));
			assert(size > 0);
			if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
				failure("Internal buffer is not big enough for "
					"uncompressed test files");
			} else {
				failure("Internal buffer is not big enough for "
					"uncompressed test file: %s", filesets[n].names[0]);
			}
			if (!assert(size < buffsize)) {
				free(rawimage);
				rawimage = NULL;
				continue;
			}
		} else {
			for (i = 0; filesets[n].names[i] != NULL; ++i)
			{
				char *newraw;
				tmp = slurpfile(&size, "%s",
						filesets[n].names[i]);
				newraw = realloc(rawimage, oldsize + size);
				if (!assert(newraw != NULL))
				{
					free(tmp);
					size = 0;
					break;
				}
				rawimage = newraw;
				memcpy(rawimage + oldsize, tmp, size);
				oldsize += size;
				size = oldsize;
				free(tmp);
			}
		}
		if (size == 0) {
			free(rawimage);
			rawimage = NULL;
			continue;
		}
		image = malloc(size);
		assert(image != NULL);
		if (image == NULL) {
			free(rawimage);
			rawimage = NULL;
			return;
		}

		assert(rawimage != NULL);

		srand((unsigned)time(NULL));

		for (i = 0; i < 1000; ++i) {
			FILE *f;
			int j, numbytes, trycnt;

			/* Fuzz < 1% of the bytes in the archive. */
			memcpy(image, rawimage, size);
			q = (int)size / 100;
			if (q < 4)
				q = 4;
			numbytes = (int)(rand() % q);
			for (j = 0; j < numbytes; ++j)
				image[rand() % size] = (char)rand();

			/* Save the messed-up image to a file.
			 * If we crash, that file will be useful. */
			for (trycnt = 0; trycnt < 3; trycnt++) {
				f = fopen("after.test.failure.send.this.file."
				    "to.libarchive.maintainers.with.system.details", "wb");
				if (f != NULL)
					break;
#if defined(_WIN32) && !defined(__CYGWIN__)
				/*
				 * Sometimes previous close operation does not completely
				 * end at this time. So we should take a wait while
				 * the operation running.
				 */
				Sleep(100);
#endif
			}
			assert(f != NULL);
			assertEqualInt((size_t)size, fwrite(image, 1, (size_t)size, f));
			fclose(f);

			// Try to read all headers and bodies.
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
					while (0 == archive_read_data_block(a,
						&blk, &blk_size, &blk_offset))
						continue;
				}
				archive_read_close(a);
			}
			archive_read_free(a);

			// Just list headers, skip bodies.
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
				}
				archive_read_close(a);
			}
			archive_read_free(a);
		}
		free(image);
		free(rawimage);
	}
}